

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::DuplicateColumn::undoFix
          (DuplicateColumn *this,HighsOptions *options,HighsSolution *solution)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  double dVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  HighsCDouble HVar16;
  double local_f8;
  HighsCDouble local_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_a0 = (options->super_HighsOptionsStruct).mip_feasibility_tolerance;
  dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  iVar3 = this->col;
  local_b8 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3];
  uStack_b0 = 0;
  dVar13 = this->colScale;
  local_98 = this->colLower;
  uStack_90 = 0;
  bVar1 = this->colIntegral;
  bVar2 = this->duplicateColIntegral;
  iVar4 = this->duplicateCol;
  if (bVar1 == true) {
    local_98 = ceil(local_98 - local_a0);
    uStack_90 = extraout_XMM0_Qb;
  }
  local_78 = this->colUpper;
  uStack_70 = 0;
  if (bVar1 != false) {
    local_78 = floor(local_78 + local_a0);
    uStack_70 = extraout_XMM0_Qb_00;
  }
  local_d0 = this->duplicateColLower;
  if (bVar2 != false) {
    local_d0 = ceil(local_d0 - local_a0);
  }
  local_80 = this->duplicateColUpper;
  uVar15 = 0;
  if (bVar2 != false) {
    local_80 = floor(local_80 + local_a0);
    uVar15 = extraout_XMM0_Qb_01;
  }
  if (bVar1 != false) {
    if (-INFINITY < local_98) {
      local_48 = (double)(~-(ulong)(INFINITY <= local_78) & (ulong)local_78 |
                         -(ulong)(INFINITY <= local_78) & 0x408f400000000000);
      local_68 = 1.0;
      dVar10 = local_98;
      uStack_40 = uStack_70;
    }
    else {
      dVar10 = 0.0;
      if (INFINITY > local_78) {
        dVar10 = local_78;
      }
      lVar7 = (ulong)(INFINITY <= local_78) * 8;
      local_68 = *(double *)(&DAT_003c50a0 + lVar7);
      local_48 = *(double *)(&DAT_003d7900 + lVar7);
      uStack_40 = 0;
    }
    local_c8 = local_d0 - dVar12;
    local_60 = dVar12 + local_80;
    local_58 = local_48 + 1e-08;
    local_48 = local_48 + -1e-08;
    do {
      dVar11 = dVar10;
      local_e0.hi = local_b8 - dVar11;
      local_e0.lo = (-dVar11 - (local_e0.hi - local_b8)) +
                    (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
      HighsCDouble::operator/=(&local_e0,dVar13);
      dVar14 = local_e0.hi + local_e0.lo;
      if ((((local_c8 <= dVar14) && (dVar14 <= local_60)) &&
          ((bVar2 == false ||
           (local_c0 = dVar14, dVar10 = round(dVar14), dVar14 = local_c0,
           ABS(local_c0 - dVar10) <= local_a0)))) ||
         ((dVar10 = local_68 + dVar11, 0.0 < local_68 && (local_58 <= dVar10)))) break;
    } while ((0.0 <= local_68) || (local_48 < dVar10));
    goto LAB_002fcb25;
  }
  if (bVar2 != false) {
    if (-INFINITY < local_d0) {
      local_c8 = 1.0;
      dVar10 = local_80;
      local_e0.hi = local_d0;
    }
    else {
      local_e0.hi = 0.0;
      if (INFINITY > local_80) {
        local_e0.hi = local_80;
      }
      local_c8 = *(double *)(&DAT_003c50a0 + (ulong)(INFINITY <= local_80) * 8);
      uVar15 = 0;
      dVar10 = -1000.0;
    }
    local_58 = (double)(~-(ulong)(INFINITY <= local_80) & (ulong)dVar10 |
                       -(ulong)(INFINITY <= local_80) & 0x408f400000000000);
    dVar10 = local_98 - dVar12;
    local_60 = local_58 + 1e-08;
    local_58 = local_58 + -1e-08;
    local_68 = dVar12 + local_78;
    uStack_50 = uVar15;
    do {
      local_e0.lo = 0.0;
      local_c0 = local_e0.hi;
      HVar16 = HighsCDouble::operator*(&local_e0,dVar13);
      dVar11 = local_b8 - HVar16.hi;
      dVar11 = (((-HVar16.hi - (dVar11 - local_b8)) + (local_b8 - (dVar11 - (dVar11 - local_b8))) +
                0.0) - HVar16.lo) + dVar11;
      dVar14 = local_c0;
      if (((dVar10 <= dVar11) && (dVar11 <= local_68)) ||
         ((local_e0.hi = local_c8 + local_c0, 0.0 < local_c8 && (local_60 <= local_e0.hi)))) break;
    } while ((0.0 <= local_c8) || (local_58 < local_e0.hi));
    goto LAB_002fcb25;
  }
  if (-INFINITY < local_d0) {
    local_e0.hi = local_d0;
    local_e0.lo = 0.0;
    HVar16 = HighsCDouble::operator*(&local_e0,dVar13);
    dVar10 = local_b8 - HVar16.hi;
    dVar10 = (((-HVar16.hi - (dVar10 - local_b8)) + (local_b8 - (dVar10 - (dVar10 - local_b8))) +
              0.0) - HVar16.lo) + dVar10;
  }
  else {
    dVar10 = *(double *)(&DAT_003c50d0 + (ulong)(0.0 < dVar13) * 8);
  }
  if (local_80 < INFINITY) {
    local_e0.lo = 0.0;
    local_e0.hi = local_80;
    HVar16 = HighsCDouble::operator*(&local_e0,dVar13);
    dVar11 = local_b8 - HVar16.hi;
    dVar11 = (((-HVar16.hi - (dVar11 - local_b8)) + (local_b8 - (dVar11 - (dVar11 - local_b8))) +
              0.0) - HVar16.lo) + dVar11;
  }
  else {
    dVar11 = *(double *)(&DAT_003ce8a0 + (ulong)(0.0 < dVar13) * 8);
  }
  dVar6 = local_78;
  local_f8 = local_98;
  if (dVar13 <= 0.0) {
    if (local_d0 == -INFINITY) {
      if (local_80 == INFINITY) goto LAB_002fcd4b;
      dVar14 = local_80;
      if (dVar11 <= dVar12 + local_78) goto LAB_002fcb25;
      local_e0.hi = local_b8 - local_78;
      local_e0.lo = (-local_78 - (local_e0.hi - local_b8)) +
                    (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
      HighsCDouble::operator/=(&local_e0,dVar13);
      dVar14 = local_e0.hi + local_e0.lo;
      bVar9 = local_d0 - dVar12 == dVar14;
      bVar8 = local_d0 - dVar12 < dVar14;
      goto LAB_002fcaa7;
    }
    dVar14 = local_d0;
    dVar11 = dVar10;
    if (local_98 - dVar12 <= dVar10) goto LAB_002fcb25;
    local_e0.hi = local_b8 - local_98;
    local_e0.lo = (-local_98 - (local_e0.hi - local_b8)) +
                  (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
    HighsCDouble::operator/=(&local_e0,dVar13);
    dVar14 = local_e0.hi + local_e0.lo;
    bVar9 = dVar14 == dVar12 + local_80;
    bVar8 = dVar14 < dVar12 + local_80;
LAB_002fc927:
    local_f8 = local_f8 - dVar12;
    dVar11 = local_98;
    if (bVar8 || bVar9) goto LAB_002fcb25;
  }
  else {
    if (local_80 != INFINITY) {
      dVar14 = local_80;
      if (local_98 - dVar12 <= dVar11) goto LAB_002fcb25;
      local_e0.hi = local_b8 - local_98;
      local_e0.lo = (-local_98 - (local_e0.hi - local_b8)) +
                    (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
      HighsCDouble::operator/=(&local_e0,dVar13);
      dVar14 = local_e0.hi + local_e0.lo;
      bVar9 = local_d0 - dVar12 == dVar14;
      bVar8 = local_d0 - dVar12 < dVar14;
      goto LAB_002fc927;
    }
    if (local_d0 == -INFINITY) {
LAB_002fcd4b:
      dVar11 = local_98;
      if (local_98 <= 0.0) {
        dVar11 = 0.0;
      }
      local_e0.hi = local_b8 - dVar11;
      local_e0.lo = (-dVar11 - (local_e0.hi - local_b8)) +
                    (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
      HighsCDouble::operator/=(&local_e0,dVar13);
      dVar14 = local_e0.hi + local_e0.lo;
      goto LAB_002fcb25;
    }
    dVar14 = local_d0;
    dVar11 = dVar10;
    if (dVar10 <= dVar12 + local_78) goto LAB_002fcb25;
    local_e0.hi = local_b8 - local_78;
    local_e0.lo = (-local_78 - (local_e0.hi - local_b8)) +
                  (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
    HighsCDouble::operator/=(&local_e0,dVar13);
    dVar14 = local_e0.hi + local_e0.lo;
    bVar9 = dVar14 == dVar12 + local_80;
    bVar8 = dVar14 < dVar12 + local_80;
LAB_002fcaa7:
    local_f8 = dVar12 + dVar6;
    dVar11 = local_78;
    if (bVar8 || bVar9) goto LAB_002fcb25;
  }
  local_e0.hi = local_b8 - local_f8;
  local_e0.lo = (-local_f8 - (local_e0.hi - local_b8)) +
                (local_b8 - (local_e0.hi - (local_e0.hi - local_b8))) + 0.0;
  HighsCDouble::operator/=(&local_e0,dVar13);
  dVar14 = local_e0.hi + local_e0.lo;
  dVar11 = local_f8;
LAB_002fcb25:
  local_e0.lo = 0.0;
  local_e0.hi = dVar14;
  local_c0 = dVar14;
  HVar16 = HighsCDouble::operator*(&local_e0,dVar13);
  local_c8 = HVar16.hi;
  if ((local_98 - dVar12 <= dVar11) &&
     (((dVar11 <= local_78 + dVar12 && (local_d0 - dVar12 <= local_c0)) &&
      (local_c0 <= dVar12 + local_80)))) {
    if (bVar1 != false) {
      dVar12 = round(dVar11);
      HVar16.lo = HVar16.lo;
      HVar16.hi = local_c8;
      if (local_a0 < ABS(dVar11 - dVar12)) {
        return;
      }
    }
    local_c8 = HVar16.hi;
    if (bVar2 == false) {
      if (0x7fefffffffffffff < (ulong)ABS(dVar11)) {
        return;
      }
    }
    else {
      dVar12 = round(local_c0);
      HVar16.lo = HVar16.lo;
      HVar16.hi = local_c8;
      if (0x7fefffffffffffff < (ulong)ABS(dVar11)) {
        return;
      }
      if (local_a0 < ABS(local_c0 - dVar12)) {
        return;
      }
    }
    if ((ulong)ABS(local_c0) < 0x7ff0000000000000) {
      dVar12 = dVar11 + HVar16.hi;
      dVar13 = dVar12 - local_b8;
      if (ABS((-local_b8 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) +
              HVar16.lo +
              (HVar16.hi - (dVar12 - dVar11)) + (dVar11 - (dVar12 - (dVar12 - dVar11))) + 0.0 +
              dVar13) <= 1e-12) {
        pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[iVar3] = dVar11;
        pdVar5[iVar4] = local_c0;
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::DuplicateColumn::undoFix(
    const HighsOptions& options, HighsSolution& solution) const {
  const double mip_feasibility_tolerance = options.mip_feasibility_tolerance;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  std::vector<double>& col_value = solution.col_value;
  const bool allow_assert = false;
  const bool debug_report = false;
  //=============================================================================================

  auto isInteger = [&](const double v) {
    return (fractionality(v) <= mip_feasibility_tolerance);
  };

  auto isFeasible = [&](const double l, const double v, const double u) {
    return v >= l - primal_feasibility_tolerance &&
           v <= u + primal_feasibility_tolerance;
  };
  const double merge_value = col_value[col];
  const double value_max = 1000;
  const double eps = 1e-8;
  const double scale = colScale;
  const bool x_int = colIntegral;
  const bool y_int = duplicateColIntegral;
  const int x_ix = col;
  const int y_ix = duplicateCol;
  const double x_lo =
      x_int ? std::ceil(colLower - mip_feasibility_tolerance) : colLower;
  const double x_up =
      x_int ? std::floor(colUpper + mip_feasibility_tolerance) : colUpper;
  const double y_lo =
      y_int ? std::ceil(duplicateColLower - mip_feasibility_tolerance)
            : duplicateColLower;
  const double y_up =
      y_int ? std::floor(duplicateColUpper + mip_feasibility_tolerance)
            : duplicateColUpper;
  if (kAllowDeveloperAssert) assert(scale);
  double x_v = merge_value;
  double y_v;

  //  assert(x_int);
  //  assert(y_int);
  //  assert(scale < 0);
  if (x_int) {
    double x_0 = 0;
    double x_d = 0;
    double x_1 = 0;
    double x_free = false;
    if (x_lo <= -kHighsInf) {
      if (x_up >= kHighsInf) {
        // x is free
        x_free = true;
        x_0 = 0;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is (-int, u]
        x_0 = x_up;
        x_d = -1.0;
        x_1 = -value_max;
      }
    } else {
      if (x_up >= kHighsInf) {
        // x is [l, inf)
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is [l, u]
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = x_up;
      }
    }
    // x is integer, so look through its possible values to find a
    // suitable y
    if (x_free && debug_report) printf("DuplicateColumn::undo x is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using x (%g; %g; %g)\n", x_0, x_d, x_1);
    bool found_y = false;
    for (x_v = x_0;; x_v += x_d) {
      //      printf("x_v = %g\n", x_v);
      y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      if (isFeasible(y_lo, y_v, y_up)) {
        found_y = !y_int || isInteger(y_v);
        if (found_y) break;
      }
      if (x_d > 0 && x_v + x_d >= x_1 + eps) break;
      if (x_d < 0 && x_v + x_d <= x_1 - eps) break;
    }
    if (allow_assert) assert(found_y);
  } else if (y_int) {
    double y_0 = 0;
    double y_d = 0;
    double y_1 = 0;
    double y_free = false;
    if (y_lo <= -kHighsInf) {
      if (y_up >= kHighsInf) {
        // y is free
        y_free = true;
        y_0 = 0;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is (-int, u]
        y_0 = y_up;
        y_d = -1.0;
        y_1 = -value_max;
      }
    } else {
      if (y_up >= kHighsInf) {
        // y is [l, inf)
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is [l, u]
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = y_up;
      }
    }
    // y is integer, so look through its possible values to find a
    // suitable x
    if (y_free && debug_report) printf("DuplicateColumn::undo y is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using y (%g; %g; %g)\n", y_0, y_d, y_1);
    bool found_x = false;
    for (y_v = y_0;; y_v += y_d) {
      //      printf("y_v = %g\n", y_v);
      x_v = double((HighsCDouble(merge_value) - HighsCDouble(y_v) * scale));
      if (isFeasible(x_lo, x_v, x_up)) {
        found_x = !x_int || isInteger(x_v);
        if (found_x) break;
      }
      if (y_d > 0 && y_v + y_d >= y_1 + eps) break;
      if (y_d < 0 && y_v + y_d <= y_1 - eps) break;
    }
    if (allow_assert) assert(found_x);
  } else {
    // x and y are both continuous
    double v_m_a_ylo = 0;
    double v_m_a_yup = 0;
    if (y_lo <= -kHighsInf) {
      v_m_a_ylo = scale > 0 ? kHighsInf : -kHighsInf;
    } else {
      v_m_a_ylo =
          double((HighsCDouble(merge_value) - HighsCDouble(y_lo) * scale));
    }
    if (y_up >= kHighsInf) {
      v_m_a_yup = scale > 0 ? -kHighsInf : kHighsInf;
    } else {
      v_m_a_yup =
          double((HighsCDouble(merge_value) - HighsCDouble(y_up) * scale));
    }
    // Need to ensure that y puts x in [x_l, x_u]
    if (scale > 0) {
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_u), V-a(y_l)] == [%g, %g]\n",
               v_m_a_yup, v_m_a_ylo);
      // V-ay is in [V-a(y_u), V-a(y_l)] == [v_m_a_yup, v_m_a_ylo]
      if (y_up < kHighsInf) {
        // If v_m_a_yup is right of x_up+eps then [v_m_a_yup, v_m_a_ylo] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is left of x_lo-eps then [v_m_a_yup, v_m_a_ylo] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_ylo);
        // This assignment is OK unless x_v > x_up-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(1==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 2==102\n");
            if (kAllowDeveloperAssert) assert(2 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    } else {  // scale < 0
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_l), V-a(y_u)] == [%g, %g]\n",
               v_m_a_ylo, v_m_a_yup);
      // V-ay is in [V-a(y_l), V-a(y_u)] == [v_m_a_ylo, v_m_a_yup]
      //
      if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is right of x_up+eps then [v_m_a_ylo, v_m_a_yup] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_ylo);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          //	  if (kAllowDeveloperAssert) assert(11==101);
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==101\n");
            if (kAllowDeveloperAssert) assert(12 == 101);
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_up < kHighsInf) {
        // If v_m_a_yup is left of x_lo-eps then [v_m_a_ylo, v_m_a_yup] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(11==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==102\n");
            if (kAllowDeveloperAssert) assert(12 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    }
  }
  const double residual_tolerance = 1e-12;
  double residual =
      std::fabs(double(HighsCDouble(x_v) + HighsCDouble(y_v) * scale -
                       HighsCDouble(merge_value)));
  const bool x_y_ok =
      isFeasible(x_lo, x_v, x_up) && isFeasible(y_lo, y_v, y_up) &&
      (!x_int || isInteger(x_v)) && (!y_int || isInteger(y_v)) &&
      (std::fabs(x_v) < kHighsInf) && (std::fabs(y_v) < kHighsInf) &&
      (residual <= residual_tolerance);

  bool check;
  check = isFeasible(x_lo, x_v, x_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(x_lo, x_v, x_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = isFeasible(y_lo, y_v, y_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(y_lo, y_v, y_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = !x_int || isInteger(x_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !x_int || isInteger(x_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = !y_int || isInteger(y_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !y_int || isInteger(y_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(x_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(x_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(y_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(y_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: residual <= residual_tolerance is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (debug_report)
    printf("DuplicateColumn::undo%s x = %g; y = %g to give x + (%g)y = %g",
           x_y_ok ? "" : " ERROR", x_v, y_v, scale, merge_value);
  if (x_y_ok) {
    if (debug_report) printf(": FIXED\n");
  } else if (check) {
    if (debug_report) printf("\n");
  } else {
    if (debug_report) printf(": residual = %g\n", residual);
  }
  //=============================================================================================
  if (x_y_ok) {
    col_value[x_ix] = x_v;
    col_value[y_ix] = y_v;
  }
}